

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char sqlite3AffinityType(char *zIn,u8 *pszEst)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  char cVar5;
  byte bVar6;
  byte *zNum;
  uint uVar7;
  int local_1c;
  
  bVar6 = *zIn;
  if (bVar6 == 0) {
    cVar5 = 'C';
LAB_0015bc9c:
    if (pszEst == (u8 *)0x0) {
      return cVar5;
    }
    *pszEst = '\x01';
    return cVar5;
  }
  pbVar1 = (byte *)(zIn + 1);
  zNum = (byte *)0x0;
  bVar4 = 0x43;
  uVar3 = 0;
LAB_0015bbb8:
  uVar7 = uVar3 << 8;
  uVar3 = ""[bVar6] | uVar7;
  if ((int)uVar3 < 0x636c6f62) {
    if (uVar3 == 0x626c6f62) {
      if ((bVar4 != 0x45) && (bVar4 != 0x43)) goto LAB_0015bc19;
      bVar6 = *pbVar1;
      if (bVar6 == 0x28) {
        zNum = pbVar1;
      }
      bVar4 = 0x41;
      goto LAB_0015bc60;
    }
    if (uVar3 == 0x63686172) {
      bVar4 = 0x42;
      zNum = pbVar1;
      goto LAB_0015bc5d;
    }
LAB_0015bc19:
    if (uVar3 != 0x646f7562 && (uVar3 != 0x666c6f61 && uVar3 != 0x7265616c) || bVar4 != 0x43) {
      if (((uint)""[bVar6] | uVar7 & 0xffffff) != 0x696e74) goto LAB_0015bc5d;
      cVar5 = 'D';
      goto LAB_0015bc9c;
    }
    bVar4 = 0x45;
  }
  else {
    if ((uVar3 != 0x636c6f62) && (uVar3 != 0x74657874)) goto LAB_0015bc19;
    bVar4 = 0x42;
  }
LAB_0015bc5d:
  bVar6 = *pbVar1;
LAB_0015bc60:
  pbVar1 = pbVar1 + 1;
  if (bVar6 == 0) {
    if ((pszEst != (u8 *)0x0) && (*pszEst = '\x01', bVar4 < 0x43)) {
      if (zNum == (byte *)0x0) {
        *pszEst = '\x05';
      }
      else {
        bVar6 = *zNum;
        while (bVar6 != 0) {
          if (0xfffffffffffffff5 < (ulong)bVar6 - 0x3a) {
            local_1c = 0;
            sqlite3GetInt32((char *)zNum,&local_1c);
            iVar2 = local_1c + 3;
            if (-1 < local_1c) {
              iVar2 = local_1c;
            }
            cVar5 = (char)(iVar2 >> 2);
            if (0xfd < iVar2 >> 2) {
              cVar5 = -2;
            }
            *pszEst = cVar5 + '\x01';
            return bVar4;
          }
          pbVar1 = zNum + 1;
          zNum = zNum + 1;
          bVar6 = *pbVar1;
        }
      }
    }
    return bVar4;
  }
  goto LAB_0015bbb8;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, u8 *pszEst){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pszEst is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pszEst ){
    *pszEst = 1;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            int v = 0;
            sqlite3GetInt32(zChar, &v);
            v = v/4 + 1;
            if( v>255 ) v = 255;
            *pszEst = v; /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            break;
          }
          zChar++;
        }
      }else{
        *pszEst = 5;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
  }
  return aff;
}